

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngx_stream_split_clients_module.c
# Opt level: O2

char * ngx_conf_split_clients_block(ngx_conf_t *cf,ngx_command_t *cmd,void *conf)

{
  ngx_pool_t *pool;
  undefined1 auVar1 [16];
  void *pvVar2;
  ngx_int_t nVar3;
  ngx_stream_variable_t *pnVar4;
  void *pvVar5;
  char *pcVar6;
  ulong uVar7;
  long lVar8;
  long lVar9;
  uint *puVar10;
  ngx_conf_t *pnVar11;
  undefined8 *puVar12;
  uint uVar13;
  uint uVar14;
  bool bVar15;
  byte bVar16;
  undefined8 local_c8;
  ngx_conf_t save;
  undefined1 auStack_48 [8];
  ngx_str_t name;
  
  bVar16 = 0;
  pvVar2 = ngx_pcalloc(cf->pool,0x50);
  pcVar6 = (char *)0xffffffffffffffff;
  if (pvVar2 != (void *)0x0) {
    pvVar5 = cf->args->elts;
    save.handler_conf = (char *)cf;
    nVar3 = ngx_stream_compile_complex_value
                      ((ngx_stream_compile_complex_value_t *)&save.handler_conf);
    if (nVar3 == 0) {
      auStack_48 = *(undefined1 (*) [8])((long)pvVar5 + 0x20);
      name.len = *(undefined8 *)((long)pvVar5 + 0x28);
      if (*(char *)name.len == '$') {
        auStack_48 = (undefined1  [8])((long)auStack_48 - 1);
        name.len = name.len + 1;
        pnVar4 = ngx_stream_add_variable(cf,(ngx_str_t *)auStack_48,1);
        if (pnVar4 != (ngx_stream_variable_t *)0x0) {
          pnVar4->get_handler = ngx_stream_split_clients_variable;
          pnVar4->data = (uintptr_t)pvVar2;
          pool = cf->pool;
          *(undefined8 *)((long)pvVar2 + 0x30) = 0;
          *(undefined8 *)((long)pvVar2 + 0x38) = 0x18;
          *(undefined8 *)((long)pvVar2 + 0x40) = 2;
          *(ngx_pool_t **)((long)pvVar2 + 0x48) = pool;
          pvVar5 = ngx_palloc(pool,0x30);
          *(void **)((long)pvVar2 + 0x28) = pvVar5;
          if (pvVar5 != (void *)0x0) {
            lVar9 = 0xc;
            pnVar11 = cf;
            puVar12 = &local_c8;
            for (lVar8 = lVar9; lVar8 != 0; lVar8 = lVar8 + -1) {
              *puVar12 = pnVar11->name;
              pnVar11 = (ngx_conf_t *)((long)pnVar11 + (ulong)bVar16 * -0x10 + 8);
              puVar12 = puVar12 + (ulong)bVar16 * -2 + 1;
            }
            cf->ctx = pvVar2;
            cf->handler = ngx_stream_split_clients;
            cf->handler_conf = (char *)conf;
            pcVar6 = ngx_conf_parse(cf,(ngx_str_t *)0x0);
            puVar12 = &local_c8;
            pnVar11 = cf;
            for (; lVar9 != 0; lVar9 = lVar9 + -1) {
              pnVar11->name = (char *)*puVar12;
              puVar12 = puVar12 + (ulong)bVar16 * -2 + 1;
              pnVar11 = (ngx_conf_t *)((long)pnVar11 + (ulong)bVar16 * -0x10 + 8);
            }
            if (pcVar6 == (char *)0x0) {
              puVar10 = *(uint **)((long)pvVar2 + 0x28);
              lVar9 = *(long *)((long)pvVar2 + 0x30);
              uVar13 = 0;
              uVar14 = 0;
              while (bVar15 = lVar9 != 0, lVar9 = lVar9 + -1, bVar15) {
                uVar7 = (ulong)*puVar10;
                uVar14 = uVar14 + *puVar10;
                if (uVar7 == 0) {
                  uVar14 = 10000;
                }
                if (10000 < uVar14) {
                  ngx_conf_log_error(1,cf,0,"percent total is greater than 100%%");
                  return (char *)0xffffffffffffffff;
                }
                if (uVar7 != 0) {
                  auVar1._8_8_ = 0;
                  auVar1._0_8_ = uVar7 * 0xffffffff;
                  uVar13 = uVar13 + SUB164(auVar1 / ZEXT816(10000),0);
                  *puVar10 = uVar13;
                }
                puVar10 = puVar10 + 6;
              }
              pcVar6 = (char *)0x0;
            }
          }
        }
      }
      else {
        ngx_conf_log_error(1,cf,0,"invalid variable name \"%V\"",auStack_48);
      }
    }
  }
  return pcVar6;
}

Assistant:

static char *
ngx_conf_split_clients_block(ngx_conf_t *cf, ngx_command_t *cmd, void *conf)
{
    char                                *rv;
    uint32_t                             sum, last;
    ngx_str_t                           *value, name;
    ngx_uint_t                           i;
    ngx_conf_t                           save;
    ngx_stream_variable_t               *var;
    ngx_stream_split_clients_ctx_t      *ctx;
    ngx_stream_split_clients_part_t     *part;
    ngx_stream_compile_complex_value_t   ccv;

    ctx = ngx_pcalloc(cf->pool, sizeof(ngx_stream_split_clients_ctx_t));
    if (ctx == NULL) {
        return NGX_CONF_ERROR;
    }

    value = cf->args->elts;

    ngx_memzero(&ccv, sizeof(ngx_stream_compile_complex_value_t));

    ccv.cf = cf;
    ccv.value = &value[1];
    ccv.complex_value = &ctx->value;

    if (ngx_stream_compile_complex_value(&ccv) != NGX_OK) {
        return NGX_CONF_ERROR;
    }

    name = value[2];

    if (name.data[0] != '$') {
        ngx_conf_log_error(NGX_LOG_EMERG, cf, 0,
                           "invalid variable name \"%V\"", &name);
        return NGX_CONF_ERROR;
    }

    name.len--;
    name.data++;

    var = ngx_stream_add_variable(cf, &name, NGX_STREAM_VAR_CHANGEABLE);
    if (var == NULL) {
        return NGX_CONF_ERROR;
    }

    var->get_handler = ngx_stream_split_clients_variable;
    var->data = (uintptr_t) ctx;

    if (ngx_array_init(&ctx->parts, cf->pool, 2,
                       sizeof(ngx_stream_split_clients_part_t))
        != NGX_OK)
    {
        return NGX_CONF_ERROR;
    }

    save = *cf;
    cf->ctx = ctx;
    cf->handler = ngx_stream_split_clients;
    cf->handler_conf = conf;

    rv = ngx_conf_parse(cf, NULL);

    *cf = save;

    if (rv != NGX_CONF_OK) {
        return rv;
    }

    sum = 0;
    last = 0;
    part = ctx->parts.elts;

    for (i = 0; i < ctx->parts.nelts; i++) {
        sum = part[i].percent ? sum + part[i].percent : 10000;
        if (sum > 10000) {
            ngx_conf_log_error(NGX_LOG_EMERG, cf, 0,
                               "percent total is greater than 100%%");
            return NGX_CONF_ERROR;
        }

        if (part[i].percent) {
            last += part[i].percent * (uint64_t) 0xffffffff / 10000;
            part[i].percent = last;
        }
    }

    return rv;
}